

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedCollator::adoptTailoring
          (RuleBasedCollator *this,CollationTailoring *t,UErrorCode *errorCode)

{
  UBool UVar1;
  CollationCacheEntry *this_00;
  CollationTailoring *size;
  CollationCacheEntry *local_50;
  UErrorCode *errorCode_local;
  CollationTailoring *t_local;
  RuleBasedCollator *this_local;
  
  size = t;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    this_00 = (CollationCacheEntry *)UMemory::operator_new((UMemory *)0x100,(size_t)size);
    local_50 = (CollationCacheEntry *)0x0;
    if (this_00 != (CollationCacheEntry *)0x0) {
      CollationCacheEntry::CollationCacheEntry(this_00,&t->actualLocale,t);
      local_50 = this_00;
    }
    this->cacheEntry = local_50;
    if (this->cacheEntry == (CollationCacheEntry *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      SharedObject::deleteIfZeroRefCount(&t->super_SharedObject);
    }
    else {
      this->data = t->data;
      this->settings = t->settings;
      SharedObject::addRef(&this->settings->super_SharedObject);
      this->tailoring = t;
      SharedObject::addRef(&this->cacheEntry->super_SharedObject);
      Locale::operator=(&this->validLocale,&t->actualLocale);
      this->actualLocaleIsSameAsValid = '\0';
    }
  }
  else {
    SharedObject::deleteIfZeroRefCount(&t->super_SharedObject);
  }
  return;
}

Assistant:

void
RuleBasedCollator::adoptTailoring(CollationTailoring *t, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        t->deleteIfZeroRefCount();
        return;
    }
    U_ASSERT(settings == NULL && data == NULL && tailoring == NULL && cacheEntry == NULL);
    cacheEntry = new CollationCacheEntry(t->actualLocale, t);
    if(cacheEntry == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        t->deleteIfZeroRefCount();
        return;
    }
    data = t->data;
    settings = t->settings;
    settings->addRef();
    tailoring = t;
    cacheEntry->addRef();
    validLocale = t->actualLocale;
    actualLocaleIsSameAsValid = FALSE;
}